

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

void ScanAnalyse(fstream *file)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string str;
  string local_250;
  ofstream resultFile;
  
  std::ofstream::ofstream(&resultFile,"C:\\Code\\C\\clion\\LR1\\token.txt",_S_out);
  poVar5 = std::operator<<((ostream *)&std::cout,"into scan...");
  std::endl<char,std::char_traits<char>>(poVar5);
  ScanByChar_abi_cxx11_(&str,file);
  std::__cxx11::string::string((string *)&buffer,"",(allocator *)&local_2d8);
  uVar14 = 0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              iVar13 = (int)uVar14;
              if ((int)str._M_string_length <= iVar13) {
                std::__cxx11::string::~string((string *)&buffer);
                std::__cxx11::string::~string((string *)&str);
                std::ofstream::~ofstream(&resultFile);
                return;
              }
              lVar11 = (long)iVar13;
              bVar8 = str._M_dataplus._M_p[lVar11];
              std::__cxx11::string::assign((char *)&buffer);
              bVar2 = IsSpace(bVar8);
              if (!bVar2) break;
              uVar14 = (ulong)(iVar13 + 1);
            }
            bVar2 = IsDivide(bVar8);
            cVar12 = (char)&buffer;
            if (!bVar2) break;
            std::__cxx11::string::push_back(cVar12);
            std::operator+(&local_2b8,&buffer,"  <");
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&relatemap_abi_cxx11_,&buffer);
            std::operator+(&local_298,&local_2b8,pmVar6);
            std::operator+(&local_2d8,&local_298,", _>");
            poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_2d8);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&sortmap_abi_cxx11_,&buffer);
            std::vector<int,_std::allocator<int>_>::push_back(&list1,pmVar7);
            std::__cxx11::string::string((string *)&local_2d8,"NONE",(allocator *)&local_298);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &list2_abi_cxx11_,&local_2d8);
            std::__cxx11::string::~string((string *)&local_2d8);
            poVar5 = std::operator<<((ostream *)&resultFile,(string *)&buffer);
            uVar14 = (ulong)(iVar13 + 1);
            std::operator<<(poVar5," ");
          }
          bVar2 = IsOperate(bVar8);
          if (!bVar2) break;
          std::__cxx11::string::push_back(cVar12);
          uVar10 = iVar13 + 1;
          bVar2 = IsOperate(str._M_dataplus._M_p[lVar11 + 1]);
          if ((int)uVar10 < (int)str._M_string_length && bVar2) {
            std::__cxx11::string::push_back(cVar12);
            uVar10 = iVar13 + 2;
          }
          std::operator+(&local_2b8,&buffer,"  <");
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&relatemap_abi_cxx11_,&buffer);
          std::operator+(&local_298,&local_2b8,pmVar6);
          std::operator+(&local_2d8,&local_298,", _>");
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_2d8);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&sortmap_abi_cxx11_,&buffer);
          std::vector<int,_std::allocator<int>_>::push_back(&list1,pmVar7);
          std::__cxx11::string::string((string *)&local_2d8,"NONE",(allocator *)&local_298);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &list2_abi_cxx11_,&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          poVar5 = std::operator<<((ostream *)&resultFile,(string *)&buffer);
          std::operator<<(poVar5," ");
          uVar14 = (ulong)uVar10;
        }
        if (9 < (byte)(bVar8 - 0x30)) break;
        std::__cxx11::string::push_back(cVar12);
        bVar2 = true;
        while( true ) {
          uVar9 = uVar14;
          lVar11 = (long)(int)uVar9;
          bVar8 = str._M_dataplus._M_p[lVar11 + 1];
          uVar14 = lVar11 + 1;
          bVar3 = IsSpace(bVar8);
          if ((((int)str._M_string_length <= (int)uVar14) || (bVar3)) || (!bVar2)) break;
          std::__cxx11::string::push_back(cVar12);
          if (((9 < (byte)(bVar8 - 0x30)) && (bVar8 != 0x2e)) && ((bVar8 & 0xdf) != 0x45)) {
            bVar2 = false;
            std::__cxx11::string::erase
                      (&buffer,buffer._M_dataplus._M_p + (buffer._M_string_length - 1));
            uVar14 = uVar9 & 0xffffffff;
          }
        }
        std::operator+(&local_2b8,&buffer," <CONST,");
        std::operator+(&local_298,&local_2b8,&buffer);
        std::operator+(&local_2d8,&local_298,">");
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_2d8);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        local_2d8._M_dataplus._M_p._0_4_ = 9;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&list1,(int *)&local_2d8);
        poVar5 = std::operator<<((ostream *)&resultFile,"iConst");
        std::operator<<(poVar5," ");
        lVar11 = 0;
        bVar2 = false;
        for (uVar9 = 0;
            uVar9 < (ulong)((long)table_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)table_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1
            ) {
          _Var4 = std::operator==(&buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&((table_abi_cxx11_.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar11));
          if (_Var4) {
            std::__cxx11::to_string(&local_2d8,(int)uVar9);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &list2_abi_cxx11_,&local_2d8);
            std::__cxx11::string::~string((string *)&local_2d8);
            bVar2 = true;
          }
          lVar11 = lVar11 + 0x20;
        }
        if (!bVar2) {
          std::__cxx11::to_string(&local_2d8,sortNumber);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &list2_abi_cxx11_,&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          sortNumber = sortNumber + 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&table_abi_cxx11_,&buffer);
        }
      }
      if (bVar8 == 0x5f || (byte)((bVar8 & 0xdf) + 0xbf) < 0x1a) break;
      std::__cxx11::string::push_back(cVar12);
      cVar1 = str._M_dataplus._M_p[lVar11 + 1];
      std::__cxx11::string::push_back(cVar12);
      uVar14 = (ulong)(iVar13 + 2);
      bVar8 = (cVar1 == '*') + 1;
      while (((long)uVar14 < (long)(int)str._M_string_length && (bVar8 != 4))) {
        cVar1 = str._M_dataplus._M_p[uVar14];
        std::__cxx11::string::push_back(cVar12);
        uVar14 = uVar14 + 1;
        if (bVar8 == 3) {
          bVar8 = cVar1 == '*' | 2;
          if (cVar1 == '/') {
            bVar8 = 4;
          }
        }
        else if (bVar8 == 2) {
          bVar8 = cVar1 == '*' | 2;
        }
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"annotation:");
      poVar5 = std::operator<<(poVar5,(string *)&buffer);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::push_back(cVar12);
    uVar14 = lVar11 + 1;
    while( true ) {
      bVar8 = str._M_dataplus._M_p[uVar14];
      bVar2 = IsSpace(bVar8);
      if ((bVar2) || ((long)(int)str._M_string_length <= (long)(uVar14 + 1))) break;
      if (((9 < (byte)(bVar8 - 0x30)) && (bVar8 != 0x5f)) && (0x19 < (byte)((bVar8 & 0xdf) + 0xbf)))
      goto LAB_00109d35;
      std::__cxx11::string::push_back(cVar12);
      uVar14 = uVar14 + 1;
    }
    uVar14 = uVar14 + 1;
LAB_00109d35:
    std::__cxx11::string::string((string *)&local_250,(string *)&buffer);
    bVar2 = IsKeyword(&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    if (bVar2) {
      std::operator+(&local_2b8,&buffer," <");
      std::operator+(&local_298,&local_2b8,&buffer);
      std::operator+(&local_2d8,&local_298,",_>");
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_2d8);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&sortmap_abi_cxx11_,&buffer);
      std::vector<int,_std::allocator<int>_>::push_back(&list1,pmVar7);
      std::__cxx11::string::string((string *)&local_2d8,"NONE",(allocator *)&local_298);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &list2_abi_cxx11_,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      poVar5 = std::operator<<((ostream *)&resultFile,(string *)&buffer);
      std::operator<<(poVar5," ");
    }
    else {
      std::operator+(&local_2b8,&buffer," <IDN,");
      std::operator+(&local_298,&local_2b8,&buffer);
      std::operator+(&local_2d8,&local_298,">");
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_2d8);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      local_2d8._M_dataplus._M_p._0_4_ = 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&list1,(int *)&local_2d8);
      poVar5 = std::operator<<((ostream *)&resultFile,"id");
      std::operator<<(poVar5," ");
      lVar11 = 0;
      bVar2 = false;
      for (uVar9 = 0;
          uVar9 < (ulong)((long)table_abi_cxx11_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)table_abi_cxx11_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1)
      {
        _Var4 = std::operator==(&buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&((table_abi_cxx11_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar11));
        if (_Var4) {
          std::__cxx11::to_string(&local_2d8,(int)uVar9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &list2_abi_cxx11_,&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          bVar2 = true;
        }
        lVar11 = lVar11 + 0x20;
      }
      if (!bVar2) {
        std::__cxx11::to_string(&local_2d8,sortNumber);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &list2_abi_cxx11_,&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        sortNumber = sortNumber + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&table_abi_cxx11_,&buffer);
      }
    }
  } while( true );
}

Assistant:

void ScanAnalyse(fstream &file) {
    ofstream resultFile("C:\\Code\\C\\clion\\LR1\\token.txt");
    cout << "into scan..." << endl;
    string str = ScanByChar(file);
    int pos = 0;
    int length = str.length();
    char ch;
    string buffer = "";
    int state = 0;
    while (pos < length) {
        ch = str[pos];
        buffer = "";
        if (IsSpace(ch)) { pos++; }
        else if (IsDivide(ch)) {
            buffer += ch;
            pos++;
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsOperate(ch)) {
            buffer += ch;
            pos++;
            if (IsOperate(ch = str[pos]) && pos < length) {
                buffer += ch;
                pos++;
            } else {
            }
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsDigit(ch)) {
            state = 1;
            buffer += ch;
            pos++;
            bool flag = true;
            while (!IsSpace(ch = str[pos]) && pos < length && flag) {
                buffer += ch;
                switch (state) {
                    case 1:
                        if (IsDigit(ch)) state = 1;
                        else if (ch == '.') state = 2;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 2:
                        if (IsDigit(ch)) state = 3;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 3:
                        if (IsDigit(ch)) state = 3;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 4:
                        if (ch == '+' || ch == '-') state = 5;
                        else if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 5:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 6:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    default:
                        pos--;
                        flag = false;
                        buffer.erase(buffer.end() - 1);
                        cout << "error!" << endl;
                        break;
                }
                pos++;
            }
            cout << buffer + " <CONST," + buffer + ">" << endl;
            list1.push_back(9);
            resultFile << "iConst" << " ";
            bool flag2 = false;
            int i = 0;
            for (i = 0; i < table.size(); i++) {
                if (buffer == table[i]) {
                    list2.push_back(to_string(i));
                    flag2 = true;
                }
            }
            if (!flag2) {
                list2.push_back(to_string(sortNumber));
                sortNumber++;
                table.push_back(buffer);
            }
        } else if (IsLetter(ch) || ch == '_') {
            buffer += ch;
            pos++;
            while (!IsSpace(ch = str[pos++]) && pos < length) {
                if (IsLetter(ch) || ch == '_' || IsDigit(ch)) {
                    buffer += ch;
                } else {
                    //fseek(fp,-1L,SEEK_CUR);
                    //fp.seekg(0,ios::cur);
                    pos--;
                    break;
                }
            }
            if (IsKeyword(buffer)) {
                cout << buffer + " <" + buffer + ",_>" << endl;
                list1.push_back(sortmap[buffer]);
                list2.push_back("NONE");
                resultFile << buffer << " ";
            } else {
                cout << buffer + " <IDN," + buffer + ">" << endl;
                list1.push_back(1);
                resultFile << "id" << " ";
                bool flag = false;
                int i = 0;
                for (i = 0; i < table.size(); i++) {
                    if (buffer == table[i]) {
                        list2.push_back(to_string(i));
                        flag = true;
                    }
                }
                if (!flag) {
                    list2.push_back(to_string(sortNumber));
                    sortNumber++;
                    table.push_back(buffer);
                }
            }
        } else if ("/") {
            state = 1;
            buffer += ch;
            pos++;
            ch = str[pos++];
            buffer += ch;
            if (ch == '*') {
                state = 2;
            }
            while (pos < length && state != 4) {
                ch = str[pos++];
                buffer += ch;
                switch (state) {
                    case 2:
                        if (ch == '*') {
                            state = 3;
                        } else {}
                        break;
                    case 3:
                        if (ch == '/') {
                            state = 4;
                        } else if (ch == '*') {
                        } else {
                            state = 2;
                        }
                        break;
                    case 4:
                        break;
                }
            }
            cout << "annotation:" << buffer << endl;
        }
    }
}